

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtransposeproxymodel.cpp
# Opt level: O2

void __thiscall
QTransposeProxyModelPrivate::onLayoutChanged
          (QTransposeProxyModelPrivate *this,QList<QPersistentModelIndex> *parents,
          LayoutChangeHint hint)

{
  QObject *this_00;
  LayoutChangeHint _t2;
  QPersistentModelIndex *persistIdx;
  QPersistentModelIndex *pQVar1;
  long lVar2;
  long in_FS_OFFSET;
  add_const_t<QList<QPersistentModelIndex>_> *__range1;
  undefined1 local_b0 [24];
  QPersistentModelIndex local_98;
  QModelIndex local_90;
  Data *local_78;
  QPersistentModelIndex *pQStack_70;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_68;
  QArrayDataPointer<QModelIndex> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->super_QAbstractProxyModelPrivate).super_QAbstractItemModelPrivate.
            super_QObjectPrivate.super_QObjectData.q_ptr;
  local_58.d = (Data *)0x0;
  local_58.ptr = (QModelIndex *)0x0;
  local_58.size = 0;
  QList<QModelIndex>::reserve
            ((QList<QModelIndex> *)&local_58,(this->layoutChangePersistentIndexes).d.size);
  pQVar1 = (this->layoutChangePersistentIndexes).d.ptr;
  for (lVar2 = (this->layoutChangePersistentIndexes).d.size << 3; lVar2 != 0; lVar2 = lVar2 + -8) {
    QPersistentModelIndex::operator_cast_to_QModelIndex(pQVar1);
    (*this_00->_vptr_QObject[0x33])((QModelIndex *)&local_78,this_00,&local_90);
    QList<QModelIndex>::emplaceBack<QModelIndex>
              ((QList<QModelIndex> *)&local_58,(QModelIndex *)&local_78);
    pQVar1 = pQVar1 + 1;
  }
  QAbstractItemModel::changePersistentIndexList
            ((QAbstractItemModel *)this_00,&this->layoutChangeProxyIndexes,
             (QModelIndexList *)&local_58);
  QList<QModelIndex>::clear(&this->layoutChangeProxyIndexes);
  QList<QPersistentModelIndex>::clear(&this->layoutChangePersistentIndexes);
  local_78 = (Data *)0x0;
  pQStack_70 = (QPersistentModelIndex *)0x0;
  local_68.ptr = (QAbstractItemModel *)0x0;
  QList<QPersistentModelIndex>::reserve((QList<QPersistentModelIndex> *)&local_78,(parents->d).size)
  ;
  pQVar1 = (parents->d).ptr;
  for (lVar2 = (parents->d).size << 3; lVar2 != 0; lVar2 = lVar2 + -8) {
    QPersistentModelIndex::operator_cast_to_QModelIndex(pQVar1);
    (*this_00->_vptr_QObject[0x33])(&local_90,this_00,local_b0);
    QPersistentModelIndex::QPersistentModelIndex(&local_98,&local_90);
    QList<QPersistentModelIndex>::emplaceBack<QPersistentModelIndex>
              ((QList<QPersistentModelIndex> *)&local_78,&local_98);
    QPersistentModelIndex::~QPersistentModelIndex(&local_98);
    pQVar1 = pQVar1 + 1;
  }
  _t2 = HorizontalSortHint;
  if (hint != VerticalSortHint) {
    _t2 = (uint)(hint == HorizontalSortHint);
  }
  QAbstractItemModel::layoutChanged
            ((QAbstractItemModel *)this_00,(QList<QPersistentModelIndex> *)&local_78,_t2);
  QArrayDataPointer<QPersistentModelIndex>::~QArrayDataPointer
            ((QArrayDataPointer<QPersistentModelIndex> *)&local_78);
  QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTransposeProxyModelPrivate::onLayoutChanged(const QList<QPersistentModelIndex> &parents, QAbstractItemModel::LayoutChangeHint hint)
{
    Q_Q(QTransposeProxyModel);
    Q_ASSERT(layoutChangeProxyIndexes.size() == layoutChangePersistentIndexes.size());
    QModelIndexList toList;
    toList.reserve(layoutChangePersistentIndexes.size());
    for (const QPersistentModelIndex &persistIdx : std::as_const(layoutChangePersistentIndexes))
        toList << q->mapFromSource(persistIdx);
    q->changePersistentIndexList(layoutChangeProxyIndexes, toList);
    layoutChangeProxyIndexes.clear();
    layoutChangePersistentIndexes.clear();
    QList<QPersistentModelIndex> proxyParents;
    proxyParents.reserve(parents.size());
    for (const QPersistentModelIndex &srcParent : parents)
        proxyParents << q->mapFromSource(srcParent);
    QAbstractItemModel::LayoutChangeHint proxyHint = QAbstractItemModel::NoLayoutChangeHint;
    if (hint == QAbstractItemModel::VerticalSortHint)
        proxyHint = QAbstractItemModel::HorizontalSortHint;
    else if (hint == QAbstractItemModel::HorizontalSortHint)
        proxyHint = QAbstractItemModel::VerticalSortHint;
    emit q->layoutChanged(proxyParents, proxyHint);
}